

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imreadwrite.h
# Opt level: O2

void __thiscall cv::Mat::release(Mat *this)

{
  int *piVar1;
  
  piVar1 = this->refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      free(this->data);
    }
  }
  *(undefined8 *)((long)&this->refcount + 4) = 0;
  this->cols = 0;
  this->c = 0;
  this->data = (uchar *)0x0;
  this->refcount = (int *)0x0;
  return;
}

Assistant:

void release()
    {
        if (refcount && NCNN_XADD(refcount, -1) == 1)
            ncnn::fastFree(data);

        data = 0;

        rows = 0;
        cols = 0;
        c = 0;

        refcount = 0;
    }